

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
VersionLessNode::Evaluate
          (string *__return_storage_ptr__,VersionLessNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  char *lhss;
  char *rhss;
  char *local_70;
  allocator<char> local_39;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *param_3_local;
  cmGeneratorExpressionContext *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  VersionLessNode *this_local;
  
  local_38 = param_4;
  param_4_local = (cmGeneratorExpressionDAGChecker *)param_3;
  param_3_local = (GeneratorExpressionContent *)param_2;
  param_2_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (VersionLessNode *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front(parameters);
  lhss = (char *)std::__cxx11::string::c_str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local,1);
  rhss = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,rhss);
  if (bVar1) {
    local_70 = "1";
  }
  else {
    local_70 = "0";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_70,&local_39);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* /*context*/,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    return cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                         parameters.front().c_str(),
                                         parameters[1].c_str())
      ? "1"
      : "0";
  }